

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_comparable.c
# Opt level: O0

int comparable_callback_ptr(comparable a,comparable b)

{
  void *void_ptr_b;
  void *void_ptr_a;
  comparable b_local;
  comparable a_local;
  undefined4 local_4;
  
  if (a < b) {
    local_4 = -1;
  }
  else if (b < a) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int comparable_callback_ptr(const comparable a, const comparable b)
{
	const void *void_ptr_a = a;
	const void *void_ptr_b = b;

	if (void_ptr_a < void_ptr_b)
	{
		return -1;
	}
	else if (void_ptr_a > void_ptr_b)
	{
		return 1;
	}
	else
	{
		return 0;
	}
}